

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

Variant * Jinx::Impl::AllAreFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Script *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  _Rb_tree_node_base *p_Var2;
  bool value;
  _Rb_tree_header *p_Var3;
  CollectionPtr collPtr;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  Variant::GetCollection((Variant *)&stack0xffffffffffffffc0);
  p_Var2 = (((element_type *)local_40)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(((element_type *)local_40)->_M_t)._M_impl.super__Rb_tree_header;
  value = true;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      if (*(int *)&p_Var2[2]._M_parent != 8) {
        this = (Script *)
               (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        Script::Error(this,"Invalid parameters to \'all (of) {} (are) finished\' function");
        __return_storage_ptr__->m_type = Null;
        Variant::SetBoolean(__return_storage_ptr__,false);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        goto LAB_001265fb;
      }
      Variant::GetCoroutine((Variant *)&local_50);
      bVar1 = (**(code **)*local_50)();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      value = (bool)(value & bVar1);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  __return_storage_ptr__->m_type = Null;
  Variant::SetBoolean(__return_storage_ptr__,value);
LAB_001265fb:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AllAreFinished(ScriptPtr script, const Parameters & params)
	{
		auto collPtr = params[0].GetCollection();
		bool allFinished = true;
		for (const auto & pair : *collPtr)
		{
			if (!pair.second.IsCoroutine())
			{
				ScriptIPtr s = std::static_pointer_cast<Script>(script);
				s->Error("Invalid parameters to 'all (of) {} (are) finished' function");
				return false;
			}
			if (!pair.second.GetCoroutine()->IsFinished())
				allFinished = false;
		}
		return allFinished;
	}